

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

Player * __thiscall Player::GetCommData_abi_cxx11_(Player *this)

{
  long in_RSI;
  string local_40 [39];
  undefined1 local_19;
  Player *this_local;
  string *data;
  
  local_19 = 0;
  this_local = this;
  std::__cxx11::stringstream::str();
  std::__cxx11::string::string(local_40);
  std::__cxx11::stringstream::str((string *)(in_RSI + 0x158));
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

std::string Player::GetCommData() {
    std::string data = m_send_queue.str();
    m_send_queue.str(std::string());
    return data;
}